

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslAssignBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  char *__rhs;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  byte local_14b;
  allocator<char> local_14a;
  byte local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_104;
  undefined1 local_100 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string indentation;
  int scalarSize;
  int indentationDepth_local;
  DataType type_local;
  string *name_local;
  string *result;
  
  indentation.field_2._12_4_ = glu::getDataTypeScalarSize(type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)indentationDepth,'\t',&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_5d = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,name)
  ;
  std::operator+(&local_80,&local_a0," = ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  uVar1 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    std::__cxx11::string::string((string *)local_100);
    __rhs = glu::getDataTypeName(type);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   __rhs);
    std::operator+(&local_c0,&local_e0,"(");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)local_100);
    uVar1 = extraout_RDX_00;
  }
  for (local_104 = 0; local_104 < (int)indentation.field_2._12_4_; local_104 = local_104 + 1) {
    local_149 = 0;
    local_14b = 0;
    if (local_104 < 1) {
      std::allocator<char>::allocator();
      local_14b = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"v",&local_14a);
    }
    else {
      de::floatToString_abi_cxx11_(&local_148,(de *)&DAT_00000001,(float)local_104 * 0.8,(int)uVar1)
      ;
      local_149 = 1;
      std::operator+(&local_128,", v+",&local_148);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    uVar1 = extraout_RDX_01;
    if ((local_14b & 1) != 0) {
      std::allocator<char>::~allocator(&local_14a);
      uVar1 = extraout_RDX_02;
    }
    if ((local_149 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_148);
      uVar1 = extraout_RDX_03;
    }
  }
  if (type != TYPE_FLOAT) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  std::operator+(&local_190,";\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_170,&local_190,"v += 0.4;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  local_5d = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::glslAssignBasicTypeObject (const string& name, glu::DataType type, int indentationDepth)
{
	const int		scalarSize		= glu::getDataTypeScalarSize(type);
	const string	indentation		= string(indentationDepth, '\t');
	string			result;

	result += indentation + name + " = ";

	if (type != glu::TYPE_FLOAT)
		result += string() + glu::getDataTypeName(type) + "(";
	for (int i = 0; i < scalarSize; i++)
		result += (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1)
						 : "v");
	if (type != glu::TYPE_FLOAT)
		result += ")";
	result += ";\n" +
			  indentation + "v += 0.4;\n";
	return result;
}